

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpc.c
# Opt level: O1

mpc_val_t * mpcf_re_and(int n,mpc_val_t **xs)

{
  mpc_parser_t *pmVar1;
  ulong uVar2;
  
  pmVar1 = (mpc_parser_t *)calloc(1,0x38);
  pmVar1->name = (char *)0x0;
  pmVar1->type = '\x03';
  pmVar1->retained = '\0';
  (pmVar1->data).lift.lf = mpcf_ctor_str;
  if (0 < n) {
    uVar2 = 0;
    do {
      pmVar1 = mpc_and(2,mpcf_strfold,pmVar1,xs[uVar2],free);
      uVar2 = uVar2 + 1;
    } while ((uint)n != uVar2);
  }
  return pmVar1;
}

Assistant:

static mpc_val_t *mpcf_re_and(int n, mpc_val_t **xs) {
  int i;
  mpc_parser_t *p = mpc_lift(mpcf_ctor_str);
  for (i = 0; i < n; i++) {
    p = mpc_and(2, mpcf_strfold, p, xs[i], free);
  }
  return p;
}